

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  stress_instance *psVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ostream *poVar6;
  ulong *puVar7;
  long *plVar8;
  size_t sVar9;
  long *plVar10;
  long lVar11;
  long *__s;
  char *pcVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  bool bVar16;
  stress_instance *psVar17;
  ulong uVar18;
  stress_instance *this;
  undefined4 uVar19;
  undefined4 uVar20;
  unique_lock<std::mutex> lock;
  condition_variable dummyConditionVariable;
  mutex dummyMutex;
  double local_c0;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<double,_std::ratio<1L,_1L>_>_>
  local_a8;
  stress_instance *local_a0;
  unique_lock<std::mutex> local_98;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  __native_type local_58;
  
  if (argc < 2) {
    uVar3 = std::thread::hardware_concurrency();
    uVar18 = (ulong)uVar3;
    local_c0 = 1.0;
    bVar16 = false;
    uVar13 = (ulong)uVar3;
  }
  else {
    local_c0 = 1.0;
    iVar5 = 1;
    uVar3 = 0;
    bVar16 = false;
    do {
      pcVar12 = argv[iVar5];
      if (*pcVar12 != '-') {
LAB_001025e3:
        iVar5 = strcmp(pcVar12,"--help");
        if (iVar5 == 0) {
          poVar6 = std::operator<<((ostream *)&std::cerr,*argv);
          poVar6 = std::operator<<(poVar6," [-t threads] [-d delay] [-f]");
          poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
          poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
          poVar6 = std::operator<<(poVar6,"threads is the number of CPUs to use. Default=0. 0=All");
          poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
          poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
          poVar6 = std::operator<<(poVar6,"delay is the number of seconds between updates. ");
          poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
          poVar6 = std::operator<<(poVar6,"Decimal fractions like 0.5 are allowed. Default=1.");
          poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
          poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
          poVar6 = std::operator<<(poVar6,"Use -f to force it to use more than the number of CPUs");
          std::endl<char,std::char_traits<char>>(poVar6);
          exit(1);
        }
        local_58.__align = (long)&local_58.__data.__kind;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Invalid switch: ","");
        plVar8 = (long *)std::__cxx11::string::append(local_58.__size);
        __s = (long *)*plVar8;
        plVar10 = plVar8 + 2;
        if (__s == plVar10) {
          local_78 = *plVar10;
          lStack_70 = plVar8[3];
          local_80 = plVar8[1];
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          __s = &local_78;
LAB_00102a39:
          local_88 = __s;
          sVar9 = strlen((char *)__s);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,(char *)__s,sVar9);
        }
        else {
          local_78 = plVar8[2];
          local_80 = plVar8[1];
          *plVar8 = (long)plVar10;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          if (__s != (long *)0x0) goto LAB_00102a39;
          local_88 = __s;
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x106170);
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
LAB_00102a7c:
        exit(2);
      }
      if ((pcVar12[1] == 't') && (pcVar12[2] == '\0')) {
        iVar5 = iVar5 + 1;
        if (argc <= iVar5) {
          pcVar12 = "Missing argument to thread count option (-t)";
LAB_00102a6f:
          poVar6 = std::operator<<((ostream *)&std::cerr,pcVar12);
          std::endl<char,std::char_traits<char>>(poVar6);
          goto LAB_00102a7c;
        }
        uVar3 = atoi(argv[iVar5]);
      }
      else if ((pcVar12[1] == 'i') && (pcVar12[2] == '\0')) {
        iVar5 = iVar5 + 1;
        if (argc <= iVar5) {
          pcVar12 = "Missing argument to iteration count option (-i)";
          goto LAB_00102a6f;
        }
        atoi(argv[iVar5]);
      }
      else if ((pcVar12[1] == 'd') && (pcVar12[2] == '\0')) {
        iVar5 = iVar5 + 1;
        if (argc <= iVar5) {
          pcVar12 = "Missing argument to delay option (-d)";
          goto LAB_00102a6f;
        }
        dVar2 = atof(argv[iVar5]);
        uVar19 = SUB84(dVar2,0);
        uVar20 = (undefined4)((ulong)dVar2 >> 0x20);
        if (dVar2 <= 0.0) {
          uVar19 = 0;
          uVar20 = 0;
        }
        local_c0 = (double)CONCAT44(uVar20,uVar19);
      }
      else if ((pcVar12[1] != 'f') || (bVar16 = true, pcVar12[2] != '\0')) goto LAB_001025e3;
      iVar5 = iVar5 + 1;
    } while (iVar5 < argc);
    uVar4 = std::thread::hardware_concurrency();
    uVar13 = (ulong)uVar4;
    uVar18 = (ulong)uVar4;
    uVar14 = (ulong)uVar3;
    if (0 < (int)uVar3) goto LAB_00102569;
  }
  uVar14 = uVar13;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Using all ",10);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," CPUs",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  uVar13 = uVar14;
LAB_00102569:
  if (uVar18 < (ulong)(long)(int)uVar14) {
    if (bVar16) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Warning, forced to use more threads than CPUs, ",0x2f);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(int)uVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," threads, but only ",0x13);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," CPUs detected!",0xf);
      uVar13 = uVar14;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Capping to ",0xb);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,". Use -f to override.",0x15);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    uVar14 = uVar13;
  }
  if (0x100 < (uint)uVar14) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Capping to ",0xb);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,". Recompile with higher max_threads.",0x24);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    uVar14 = 0x100;
  }
  lVar11 = uVar14 * 0x98;
  puVar7 = (ulong *)operator_new__(lVar11 + 8);
  *puVar7 = uVar14;
  psVar1 = (stress_instance *)(puVar7 + 1);
  local_a0 = psVar1;
  if ((int)uVar14 != 0) {
    lVar15 = 0;
    psVar17 = psVar1;
    do {
      stress_instance::stress_instance(psVar17);
      lVar15 = lVar15 + -0x98;
      psVar17 = psVar17 + 1;
      this = psVar1;
    } while (uVar14 * -0x98 - lVar15 != 0);
    do {
      stress_instance::run(this);
      lVar11 = lVar11 + -0x98;
      this = this + 1;
    } while (lVar11 != 0);
  }
  local_58._16_8_ = 0;
  local_58.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_58.__align = 0;
  local_58._8_8_ = 0;
  local_58.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable((condition_variable *)&local_88);
  local_98._M_owns = false;
  local_98._M_device = (mutex_type *)&local_58;
  std::unique_lock<std::mutex>::lock(&local_98);
  local_98._M_owns = true;
  lVar11 = std::chrono::_V2::system_clock::now();
  local_a8.__d.__r = (duration)((double)lVar11 / 1000000000.0);
  do {
    if (0.0 < local_c0) {
      local_a8.__d.__r = (duration)((double)local_a8.__d.__r + local_c0);
      std::condition_variable::__wait_until_impl<std::chrono::duration<double,std::ratio<1l,1l>>>
                ((condition_variable *)&local_88,&local_98,&local_a8);
    }
    psVar17 = psVar1;
    if (uVar14 != 0) {
      do {
        *(undefined8 *)(std::thread::hardware_concurrency + *(long *)(std::cout + -0x18)) = 5;
        stress_instance::getCount(psVar17);
        poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"M ",2);
        psVar17 = psVar17 + 1;
      } while (psVar17 != (stress_instance *)(puVar7 + uVar14 * 0x13 + 1));
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
  } while( true );
}

Assistant:

int main(int argc, char** argv)
{
    int threads = 0;
    bool force = false;
    int timeLimit = -1;
    double interval = 1.0;

    for (int i = 1; i < argc; ++i)
    {
        if (!strcmp(argv[i], "-t"))
        {
            if (i + 1 >= argc)
                error("Missing argument to thread count option (-t)");
            threads = atoi(argv[++i]);
        }
        else if (!strcmp(argv[i], "-i"))
        {
            if (i + 1 >= argc)
                error("Missing argument to iteration count option (-i)");
            timeLimit = atoi(argv[++i]);
        }
        else if (!strcmp(argv[i], "-d"))
        {
            if (i + 1 >= argc)
                error("Missing argument to delay option (-d)");
            interval = (std::max)(0.0, atof(argv[++i]));
        }
        else if (!strcmp(argv[i], "-f"))
        {
            force = true;
        }
        else if (!strcmp(argv[i], "--help"))
        {
            std::cerr << argv[0] << " [-t threads] [-d delay] [-f]" << std::endl <<
                std::endl <<
                "threads is the number of CPUs to use. Default=0. 0=All" << std::endl <<
                std::endl <<
                "delay is the number of seconds between updates. " << std::endl <<
                "Decimal fractions like 0.5 are allowed. Default=1." << std::endl <<
                std::endl <<
                "Use -f to force it to use more than the number of CPUs" << std::endl;
            exit(1);
        }
        else
        {
            error((std::string("Invalid switch: ") + argv[i]).c_str());
        }
    }

    std::size_t cpuCount = std::thread::hardware_concurrency();

    if (threads <= 0)
    {
        std::cerr << "Using all " << cpuCount << " CPUs" << std::endl;
        threads = cpuCount;
    }

    if (threads > cpuCount)
    {
        if (force)
        {
            std::cerr << "Warning, forced to use more threads"
                         " than CPUs, " << threads << " threads,"
                         " but only " << cpuCount <<
                         " CPUs detected!" << std::endl;
        }
        else
        {
            std::cerr << "Capping to " << cpuCount <<
                    ". Use -f to override." << std::endl;
            threads = cpuCount;
        }
    }

    if (threads > max_threads)
    {
        std::cerr << "Capping to " << max_threads <<
                ". Recompile with higher max_threads." << std::endl;
        threads = max_threads;
    }

    return run_stress(threads, timeLimit, interval);
}